

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_list_to_uvector_op(sexp ctx,sexp self,sexp_sint_t n,sexp etype,sexp ls)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 x [16];
  undefined1 x_00 [16];
  uchar uVar15;
  unsigned_short uVar16;
  sexp psVar17;
  ulong in_RCX;
  long lVar18;
  sexp in_RDI;
  sexp in_R8;
  bool bVar19;
  double dVar20;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp tmp;
  sexp ls2;
  unsigned_long_long max;
  longlong min;
  long i;
  long et;
  sexp in_stack_fffffffffffffe58;
  sexp in_stack_fffffffffffffe60;
  sexp in_stack_fffffffffffffe68;
  sexp in_stack_fffffffffffffe70;
  sexp in_stack_fffffffffffffe78;
  sexp in_stack_fffffffffffffe80;
  sexp in_stack_fffffffffffffe88;
  sexp in_stack_fffffffffffffe90;
  sexp_sint_t in_stack_fffffffffffffe98;
  sexp in_stack_fffffffffffffea0;
  sexp in_stack_fffffffffffffea8;
  long local_150;
  long local_148;
  undefined4 local_140;
  undefined4 local_138;
  int local_130;
  int local_128;
  sexp local_100;
  sexp local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  sexp local_c8;
  sexp local_a8;
  sexp local_a0;
  sexp_gc_var_t local_78;
  sexp local_68;
  sexp local_60;
  sexp local_58;
  sexp local_50;
  long local_48;
  long local_40;
  long local_38;
  sexp local_30;
  ulong local_28;
  sexp local_10;
  
  if ((in_RCX & 1) != 1) {
    psVar17 = sexp_type_exception(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                                  (sexp_uint_t)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    return psVar17;
  }
  local_68 = (sexp)0x43e;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_10 = in_RDI;
  memset(&local_78,0,0x10);
  psVar17 = sexp_listp_op(local_10,(sexp)0x0,1,local_30);
  if (psVar17 == (sexp)0x0) {
    if ((((ulong)local_30 & 3) == 0) && (local_30->tag == 0x13)) {
      local_a0 = local_30;
    }
    else {
      local_a0 = sexp_xtype_exception
                           (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                            (char *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    }
    return local_a0;
  }
  local_78.var = &local_68;
  local_78.next = (local_10->value).context.saves;
  (local_10->value).context.saves = &local_78;
  auVar2._8_8_ = (long)local_28 >> 0x3f;
  auVar2._0_8_ = local_28 & 0xfffffffffffffffe;
  local_38 = SUB168(auVar2 / SEXT816(2),0);
  if (local_38 == 3) {
    sexp_length_op(local_10,(sexp)0x0,1,local_30);
    local_a8 = sexp_make_bytes_op(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                                  (sexp_sint_t)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                                  in_stack_fffffffffffffe68);
  }
  else {
    sexp_length_op(local_10,(sexp)0x0,1,local_30);
    local_a8 = sexp_make_uvector_op
                         (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                          in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                          in_stack_fffffffffffffe88);
  }
  local_68 = local_a8;
  if ("#ususususuffccff"[local_38] == 's') {
    local_48 = -1L << (""[local_38] - 1 & 0x3f);
    local_50 = (sexp)((1L << (""[local_38] - 1 & 0x3f)) - 1);
  }
  else {
    local_48 = 0;
    if (""[local_38] == '@') {
      local_c8 = (sexp)0xffffffffffffffff;
    }
    else {
      local_c8 = (sexp)((1L << (""[local_38] & 0x3f)) - 1);
    }
    local_50 = local_c8;
  }
  local_58 = local_30;
  do {
    bVar19 = false;
    if (((ulong)local_58 & 3) == 0) {
      bVar19 = local_58->tag == 6;
    }
    if (!bVar19) goto LAB_001212d6;
    local_60 = (local_58->value).cnd.test;
    if (("#ususususuffccff"[local_38] == 'u') || ("#ususususuffccff"[local_38] == 's')) {
      lVar18 = (long)local_60 >> 0x3f;
      if ((local_48 == 0) && ((((ulong)local_60 & 3) == 0 && (local_60->tag == 0xc)))) {
        if ((local_60->value).flonum_bits[0] < '\x01') goto LAB_001211ae;
      }
      else {
        if ((((ulong)local_60 & 1) != 1) && ((((ulong)local_60 & 3) != 0 || (local_60->tag != 0xc)))
           ) {
LAB_001211ae:
          local_68 = sexp_cons_op(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                                  (sexp_sint_t)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                                  in_stack_fffffffffffffe58);
          x._8_8_ = in_stack_fffffffffffffe68;
          x._0_8_ = in_stack_fffffffffffffe60;
          psVar17 = sexp_make_integer(in_stack_fffffffffffffe78,(sexp_lsint_t)x);
          (local_68->value).type.name = psVar17;
          x_00._8_8_ = in_stack_fffffffffffffe68;
          x_00._0_8_ = in_stack_fffffffffffffe60;
          psVar17 = sexp_make_integer(in_stack_fffffffffffffe78,(sexp_lsint_t)x_00);
          (local_68->value).type.cpl = psVar17;
          local_68 = sexp_list2(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                                in_stack_fffffffffffffe70);
          local_68 = sexp_xtype_exception
                               (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                                (char *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
LAB_001212d6:
          if ((((ulong)local_68 & 3) != 0) || (local_68->tag != 0x13)) {
            local_40 = 0;
            while( true ) {
              bVar19 = false;
              if (((ulong)local_30 & 3) == 0) {
                bVar19 = local_30->tag == 6;
              }
              if (!bVar19) break;
              switch(local_38) {
              case 1:
                uVar1 = (local_30->value).stack.length;
                auVar6._8_8_ = (long)uVar1 >> 0x3f;
                auVar6._0_8_ = uVar1 & 0xfffffffffffffffe;
                if (SUB168(auVar6 / SEXT816(2),0) == 0) {
                  psVar17 = (local_68->value).type.name;
                  (psVar17->value).flonum_bits[local_40 / 8 + 8] =
                       (psVar17->value).flonum_bits[local_40 / 8 + 8] &
                       ((byte)(1 << ((byte)(local_40 % 8) & 0x1f)) ^ 0xff);
                }
                else {
                  psVar17 = (local_68->value).type.name;
                  (psVar17->value).flonum_bits[local_40 / 8 + 8] =
                       (psVar17->value).flonum_bits[local_40 / 8 + 8] |
                       (byte)(1 << ((byte)(local_40 % 8) & 0x1f));
                }
                break;
              case 2:
                uVar1 = (local_30->value).stack.length;
                auVar7._8_8_ = (long)uVar1 >> 0x3f;
                auVar7._0_8_ = uVar1 & 0xfffffffffffffffe;
                (((local_68->value).type.name)->value).flonum_bits[local_40 + 8] =
                     SUB161(auVar7 / SEXT816(2),0);
                break;
              case 3:
                uVar1 = (local_30->value).stack.length;
                auVar8._8_8_ = (long)uVar1 >> 0x3f;
                auVar8._0_8_ = uVar1 & 0xfffffffffffffffe;
                (local_68->value).flonum_bits[(local_40 << 1) / 2 + 8] =
                     SUB161(auVar8 / SEXT816(2),0);
                break;
              case 4:
                uVar1 = (local_30->value).stack.length;
                auVar9._8_8_ = (long)uVar1 >> 0x3f;
                auVar9._0_8_ = uVar1 & 0xfffffffffffffffe;
                *(short *)((long)&((local_68->value).type.name)->value + local_40 * 2 + 8) =
                     SUB162(auVar9 / SEXT816(2),0);
                break;
              case 5:
                uVar1 = (local_30->value).stack.length;
                auVar10._8_8_ = (long)uVar1 >> 0x3f;
                auVar10._0_8_ = uVar1 & 0xfffffffffffffffe;
                *(short *)((long)&((local_68->value).type.name)->value + local_40 * 2 + 8) =
                     SUB162(auVar10 / SEXT816(2),0);
                break;
              case 6:
                if (((local_30->value).stack.length & 1) == 1) {
                  uVar1 = (local_30->value).stack.length;
                  auVar11._8_8_ = (long)uVar1 >> 0x3f;
                  auVar11._0_8_ = uVar1 & 0xfffffffffffffffe;
                  local_128 = SUB164(auVar11 / SEXT816(2),0);
                }
                else {
                  if ((((local_30->value).stack.length & 3) == 0) &&
                     (((local_30->value).type.name)->tag == 0xc)) {
                    local_130 = (int)(((local_30->value).type.name)->value).flonum_bits[0] *
                                (int)(((local_30->value).type.name)->value).uvector.length;
                  }
                  else {
                    local_130 = 0;
                  }
                  local_128 = local_130;
                }
                *(int *)((long)&((local_68->value).type.name)->value + local_40 * 4 + 8) = local_128
                ;
                break;
              case 7:
                if (((local_30->value).stack.length & 1) == 1) {
                  uVar1 = (local_30->value).stack.length;
                  auVar12._8_8_ = (long)uVar1 >> 0x3f;
                  auVar12._0_8_ = uVar1 & 0xfffffffffffffffe;
                  local_138 = SUB164(auVar12 / SEXT816(2),0);
                }
                else {
                  if ((((local_30->value).stack.length & 3) == 0) &&
                     (((local_30->value).type.name)->tag == 0xc)) {
                    local_140 = (undefined4)(((local_30->value).type.name)->value).uvector.length;
                  }
                  else {
                    local_140 = 0;
                  }
                  local_138 = local_140;
                }
                *(undefined4 *)((long)&((local_68->value).type.name)->value + local_40 * 4 + 8) =
                     local_138;
                break;
              case 8:
                if (((local_30->value).stack.length & 1) == 1) {
                  uVar1 = (local_30->value).stack.length;
                  auVar13._8_8_ = (long)uVar1 >> 0x3f;
                  auVar13._0_8_ = uVar1 & 0xfffffffffffffffe;
                  local_148 = SUB168(auVar13 / SEXT816(2),0);
                }
                else {
                  if ((((local_30->value).stack.length & 3) == 0) &&
                     (((local_30->value).type.name)->tag == 0xc)) {
                    local_150 = (long)(((local_30->value).type.name)->value).flonum_bits[0] *
                                (((local_30->value).type.name)->value).uvector.length;
                  }
                  else {
                    local_150 = 0;
                  }
                  local_148 = local_150;
                }
                *(long *)((long)&((local_68->value).type.name)->value + local_40 * 8 + 8) =
                     local_148;
                break;
              case 9:
                if (((local_30->value).stack.length & 1) == 1) {
                  uVar1 = (local_30->value).stack.length;
                  auVar14._8_8_ = (long)uVar1 >> 0x3f;
                  auVar14._0_8_ = uVar1 & 0xfffffffffffffffe;
                  psVar17 = SUB168(auVar14 / SEXT816(2),0);
                }
                else if ((((local_30->value).stack.length & 3) == 0) &&
                        (((local_30->value).type.name)->tag == 0xc)) {
                  psVar17 = (((local_30->value).type.name)->value).type.slots;
                }
                else {
                  psVar17 = (sexp)0x0;
                }
                *(sexp *)((long)&((local_68->value).type.name)->value + local_40 * 8 + 8) = psVar17;
                break;
              case 10:
                dVar20 = sexp_to_double(in_stack_fffffffffffffe58,(sexp)0x1218c0);
                *(float *)((long)&((local_68->value).type.name)->value + local_40 * 4 + 8) =
                     (float)dVar20;
                break;
              case 0xb:
                dVar20 = sexp_to_double(in_stack_fffffffffffffe58,(sexp)0x1218fc);
                *(double *)((long)&((local_68->value).type.name)->value + local_40 * 8 + 8) = dVar20
                ;
                break;
              case 0xc:
                dVar20 = sexp_to_double(in_stack_fffffffffffffe58,(sexp)0x121986);
                *(float *)((long)&((local_68->value).type.name)->value + local_40 * 8 + 8) =
                     (float)dVar20;
                dVar20 = sexp_to_double(in_stack_fffffffffffffe58,(sexp)0x121a0d);
                *(float *)((long)&((local_68->value).type.name)->value + local_40 * 8 + 0xc) =
                     (float)dVar20;
                break;
              case 0xd:
                dVar20 = sexp_to_double(in_stack_fffffffffffffe58,(sexp)0x121a9e);
                *(double *)((long)&((local_68->value).type.name)->value + local_40 * 0x10 + 8) =
                     dVar20;
                in_stack_fffffffffffffe68 = local_10;
                dVar20 = sexp_to_double(in_stack_fffffffffffffe58,(sexp)0x121b21);
                *(double *)((long)&((local_68->value).type.name)->value + local_40 * 0x10 + 0x10) =
                     dVar20;
                break;
              case 0xe:
                sexp_to_double(in_stack_fffffffffffffe58,(sexp)0x121844);
                uVar15 = sexp_double_to_quarter((double)in_stack_fffffffffffffe68);
                (((local_68->value).type.name)->value).flonum_bits[local_40 + 8] = uVar15;
                break;
              case 0xf:
                sexp_to_double(in_stack_fffffffffffffe58,(sexp)0x121881);
                uVar16 = sexp_double_to_half((double)in_stack_fffffffffffffe68);
                *(unsigned_short *)((long)&((local_68->value).type.name)->value + local_40 * 2 + 8)
                     = uVar16;
              }
              local_30 = (local_30->value).type.cpl;
              local_40 = local_40 + 1;
            }
          }
          (local_10->value).context.saves = local_78.next;
          return local_68;
        }
        if (((ulong)local_60 & 1) == 1) {
          auVar3._8_8_ = lVar18;
          auVar3._0_8_ = (ulong)local_60 & 0xfffffffffffffffe;
          local_d8 = SUB168(auVar3 / SEXT816(2),0);
        }
        else {
          if ((((ulong)local_60 & 3) == 0) && (local_60->tag == 0xc)) {
            local_e0 = (long)(local_60->value).flonum_bits[0] * (local_60->value).uvector.length;
          }
          else {
            local_e0 = 0;
          }
          local_d8 = local_e0;
        }
        if (local_d8 < local_48) goto LAB_001211ae;
      }
      if (((ulong)local_60 & 1) == 1) {
        auVar4._8_8_ = lVar18;
        auVar4._0_8_ = (ulong)local_60 & 0xfffffffffffffffe;
        local_e8 = SUB168(auVar4 / SEXT816(2),0);
      }
      else {
        if ((((ulong)local_60 & 3) == 0) && (local_60->tag == 0xc)) {
          local_f0 = (long)(local_60->value).flonum_bits[0] * (local_60->value).uvector.length;
        }
        else {
          local_f0 = 0;
        }
        local_e8 = local_f0;
      }
      if (-1 < local_e8) {
        if (((ulong)local_60 & 1) == 1) {
          auVar5._8_8_ = lVar18;
          auVar5._0_8_ = (ulong)local_60 & 0xfffffffffffffffe;
          local_f8 = SUB168(auVar5 / SEXT816(2),0);
        }
        else {
          if ((((ulong)local_60 & 3) == 0) && (local_60->tag == 0xc)) {
            local_100 = (local_60->value).type.slots;
          }
          else {
            local_100 = (sexp)0x0;
          }
          local_f8 = local_100;
        }
        if (local_50 < local_f8) goto LAB_001211ae;
      }
    }
    else if ("#ususususuffccff"[local_38] == 'c') {
      if ((((((ulong)local_60 & 1) != 1) && ((((ulong)local_60 & 3) != 0 || (local_60->tag != 0xc)))
           ) && ((((ulong)local_60 & 3) != 0 || (local_60->tag != 0xb)))) &&
         (((((ulong)local_60 & 3) != 0 || (local_60->tag != 0xd)) &&
          ((((ulong)local_60 & 3) != 0 || (local_60->tag != 0xe)))))) goto LAB_001211ae;
    }
    else if ((((((ulong)local_60 & 1) != 1) &&
              ((((((ulong)local_60 & 3) != 0 || (local_60->tag != 0xc)) &&
                (((ulong)local_60 & 1) != 1)) &&
               ((((ulong)local_60 & 3) != 0 || (local_60->tag != 0xc)))))) &&
             ((((ulong)local_60 & 3) != 0 || (local_60->tag != 0xb)))) &&
            ((((ulong)local_60 & 3) != 0 || (local_60->tag != 0xd)))) goto LAB_001211ae;
    local_58 = (local_58->value).type.cpl;
  } while( true );
}

Assistant:

sexp sexp_list_to_uvector_op(sexp ctx, sexp self, sexp_sint_t n, sexp etype, sexp ls) {
  long et, i;
  long long min;
  unsigned long long max;
  sexp ls2, tmp;
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, etype);
  sexp_gc_var1(res);
  if (!sexp_listp(ctx, ls)) {
    res = sexp_exceptionp(ls) ? ls
      : sexp_xtype_exception(ctx, self, "list->uvector expected a list", ls);
  } else {
    sexp_gc_preserve1(ctx, res);
    et = sexp_unbox_fixnum(etype);
    res = et == SEXP_U8 ? sexp_make_bytes(ctx, sexp_length(ctx, ls), SEXP_VOID) : sexp_make_uvector(ctx, etype, sexp_length(ctx, ls));
    if (sexp_uvector_prefix(et) == 's') {
      min = (-1LL << (sexp_uvector_element_size(et)-1));
      max = (1LL << (sexp_uvector_element_size(et)-1)) - 1LL;
    } else {
      min = 0;
      max = sexp_uvector_element_size(et) == 64 ? -1 :
        (1uLL << sexp_uvector_element_size(et)) - 1LL;
    }
    for (ls2=ls; sexp_pairp(ls2); ls2=sexp_cdr(ls2)) {
      tmp = sexp_car(ls2);
      if (
#if SEXP_USE_UNIFORM_VECTOR_LITERALS
          ((sexp_uvector_prefix(et) == 'u') || (sexp_uvector_prefix(et) == 's')) ?
#endif
          !((min == 0 && sexp_bignump(tmp) ? sexp_bignum_sign(tmp) > 0 : sexp_exact_integerp(tmp) && sexp_sint_value(tmp) >= min)
            && (sexp_sint_value(tmp) < 0 || sexp_uint_value(tmp) <= max))
#if SEXP_USE_UNIFORM_VECTOR_LITERALS
          : ((sexp_uvector_prefix(et) == 'c') ? !sexp_numberp(tmp) :
          !(sexp_exact_integerp(tmp) || sexp_realp(tmp)))
#endif
          ) {
        res = sexp_cons(ctx, SEXP_FALSE, SEXP_FALSE);
        sexp_car(res) = sexp_make_integer(ctx, min);
        sexp_cdr(res) = sexp_make_integer(ctx, max);
        res = sexp_list2(ctx, res, tmp);
        res = sexp_xtype_exception(ctx, self, "invalid uniform vector value", res);
        break;
      }
    }
    if (!sexp_exceptionp(res)) {
      for (i=0; sexp_pairp(ls); ls=sexp_cdr(ls), i++) {
#if SEXP_USE_UNIFORM_VECTOR_LITERALS
        switch (et) {
        case SEXP_U1:
          sexp_bit_set(res, i, sexp_unbox_fixnum(sexp_car(ls))); break;
        case SEXP_S8:
          ((signed char*)sexp_uvector_data(res))[i] = sexp_unbox_fixnum(sexp_car(ls)); break;
        case SEXP_U8:
#endif
          sexp_bytes_set(res, sexp_make_fixnum(i), sexp_car(ls));
#if SEXP_USE_UNIFORM_VECTOR_LITERALS
          break;
        case SEXP_S16:
          ((signed short*)sexp_uvector_data(res))[i] = sexp_unbox_fixnum(sexp_car(ls)); break;
        case SEXP_U16:
          ((unsigned short*)sexp_uvector_data(res))[i] = sexp_unbox_fixnum(sexp_car(ls)); break;
        case SEXP_S32:
          ((int32_t*)sexp_uvector_data(res))[i] = sexp_sint_value(sexp_car(ls)); break;
        case SEXP_U32:
          ((uint32_t*)sexp_uvector_data(res))[i] = sexp_uint_value(sexp_car(ls)); break;
        case SEXP_S64:
          ((int64_t*)sexp_uvector_data(res))[i] = sexp_sint_value(sexp_car(ls)); break;
        case SEXP_U64:
          ((uint64_t*)sexp_uvector_data(res))[i] = sexp_uint_value(sexp_car(ls)); break;
#if SEXP_USE_FLONUMS
#if SEXP_USE_MINI_FLOAT_UNIFORM_VECTORS
        case SEXP_F8:
          ((unsigned char*)sexp_uvector_data(res))[i] = sexp_double_to_quarter(sexp_to_double(ctx, sexp_car(ls))); break;
        case SEXP_F16:
          ((unsigned short*)sexp_uvector_data(res))[i] = sexp_double_to_half(sexp_to_double(ctx, sexp_car(ls))); break;
#endif
        case SEXP_F32:
          ((float*)sexp_uvector_data(res))[i] = sexp_to_double(ctx, sexp_car(ls)); break;
        case SEXP_F64:
          ((double*)sexp_uvector_data(res))[i] = sexp_to_double(ctx, sexp_car(ls)); break;
#endif
#if SEXP_USE_COMPLEX
        case SEXP_C64:
          ((float*)sexp_uvector_data(res))[i*2] =
            sexp_to_double(ctx, sexp_real_part(sexp_car(ls)));
          ((float*)sexp_uvector_data(res))[i*2 + 1] =
            sexp_to_double(ctx, sexp_imag_part(sexp_car(ls)));
          break;
        case SEXP_C128:
          ((double*)sexp_uvector_data(res))[i*2] =
            sexp_to_double(ctx, sexp_real_part(sexp_car(ls)));
          ((double*)sexp_uvector_data(res))[i*2 + 1] =
            sexp_to_double(ctx, sexp_imag_part(sexp_car(ls)));
          break;
#endif
        }
#endif  /* SEXP_USE_UNIFORM_VECTOR_LITERALS */
      }
    }
    sexp_gc_release1(ctx);
  }
  return res;
}